

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spvIR.h
# Opt level: O0

void __thiscall spv::Instruction::setIdOperand(Instruction *this,uint idx,Id id)

{
  Id IVar1;
  bool bVar2;
  reference pvVar3;
  reference local_28;
  Id local_18;
  uint local_14;
  Id id_local;
  uint idx_local;
  Instruction *this_local;
  
  local_18 = id;
  local_14 = idx;
  _id_local = this;
  if (id == 0) {
    __assert_fail("id",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/spvIR.h"
                  ,0x71,"void spv::Instruction::setIdOperand(unsigned int, Id)");
  }
  local_28 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->idOperand,(ulong)idx);
  bVar2 = std::_Bit_reference::operator_cast_to_bool(&local_28);
  IVar1 = local_18;
  if (!bVar2) {
    __assert_fail("idOperand[idx]",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/spvIR.h"
                  ,0x72,"void spv::Instruction::setIdOperand(unsigned int, Id)");
  }
  pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (&this->operands,(ulong)local_14);
  *pvVar3 = IVar1;
  return;
}

Assistant:

void setIdOperand(unsigned idx, Id id) {
        assert(id);
        assert(idOperand[idx]);
        operands[idx] = id;
    }